

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

void __thiscall ON_RevSurface::ON_RevSurface(ON_RevSurface *this)

{
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  ON_3dPoint local_40;
  double local_28;
  double dStack_20;
  double local_18;
  ON_RevSurface *local_10;
  ON_RevSurface *this_local;
  
  local_10 = this;
  ON_Surface::ON_Surface(&this->super_ON_Surface);
  (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b783c0;
  this->m_curve = (ON_Curve *)0x0;
  local_18 = ON_3dPoint::Origin.z;
  local_28 = ON_3dPoint::Origin.x;
  dStack_20 = ON_3dPoint::Origin.y;
  ON_3dPoint::ON_3dPoint(&local_40,&ON_3dVector::ZAxis);
  from_pt.y = dStack_20;
  from_pt.x = local_28;
  from_pt.z = local_18;
  to_pt.y = local_40.y;
  to_pt.x = local_40.x;
  to_pt.z = local_40.z;
  ON_Line::ON_Line(&this->m_axis,from_pt,to_pt);
  ON_Interval::ON_Interval(&this->m_angle,0.0,6.283185307179586);
  ON_Interval::ON_Interval(&this->m_t,0.0,6.283185307179586);
  this->m_bTransposed = false;
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  if (m_s_ON_RevSurface_ptr != (void *)0x0) {
    (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
         (_func_int **)m_s_ON_RevSurface_ptr;
  }
  return;
}

Assistant:

ON_RevSurface::ON_RevSurface() : m_curve(0), 
                                 m_axis( ON_3dPoint::Origin, ON_3dVector::ZAxis ), 
                                 m_angle( 0.0, 2.0*ON_PI ),
                                 m_t( 0.0, 2.0*ON_PI ),
                                 m_bTransposed(0)
{
  ON__SET__THIS__PTR(m_s_ON_RevSurface_ptr);
}